

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple9_rle.h
# Opt level: O2

uint32_t FastPForLib::Simple9_Codec::Decompress
                   (uint32_t *input,uint32_t inOffset,uint32_t *output,uint32_t outOffset,
                   uint32_t outCount)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  
  uVar4 = outCount + outOffset;
  uVar2 = (ulong)inOffset;
  while( true ) {
    uVar5 = uVar4 - outOffset;
    if (uVar4 < outOffset || uVar5 == 0) break;
    uVar8 = input[uVar2];
    uVar6 = (ulong)((uVar8 >> 0x1c) << 2);
    uVar3 = *(uint *)((long)&Simple9_Codec_intNumber + uVar6);
    uVar1 = *(uint *)((long)&Simple9_Codec_bitLength + uVar6);
    if (uVar3 < uVar5) {
      uVar5 = uVar3;
    }
    uVar3 = ~(-1 << (uVar1 & 0x1f));
    for (uVar6 = 0; (uint)uVar6 < uVar5; uVar6 = (ulong)((uint)uVar6 + 7)) {
      uVar7 = uVar8 >> (uVar1 & 0x1f);
      output[outOffset + uVar6] = uVar8 & uVar3;
      uVar9 = uVar7 >> (uVar1 & 0x1f);
      output[(ulong)outOffset + uVar6 + 1] = uVar7 & uVar3;
      uVar8 = uVar9 >> (uVar1 & 0x1f);
      output[(ulong)outOffset + uVar6 + 2] = uVar9 & uVar3;
      uVar10 = uVar8 >> (uVar1 & 0x1f);
      output[(ulong)outOffset + uVar6 + 3] = uVar8 & uVar3;
      uVar9 = uVar10 >> (uVar1 & 0x1f);
      uVar7 = uVar9 >> (uVar1 & 0x1f);
      output[(ulong)outOffset + uVar6 + 4] = uVar10 & uVar3;
      uVar8 = uVar7 >> (uVar1 & 0x1f);
      output[(ulong)outOffset + uVar6 + 5] = uVar9 & uVar3;
      output[(ulong)outOffset + uVar6 + 6] = uVar7 & uVar3;
    }
    for (; uVar6 < uVar5; uVar6 = uVar6 + 1) {
      uVar7 = uVar8 & uVar3;
      uVar8 = uVar8 >> (uVar1 & 0x1f);
      output[outOffset + uVar6] = uVar7;
    }
    uVar2 = (ulong)((uint32_t)uVar2 + 1);
    outOffset = outOffset + uVar5;
  }
  return (uint32_t)uVar2;
}

Assistant:

static uint32_t Decompress(const uint32_t *input, uint32_t inOffset,
                             uint32_t *output, uint32_t outOffset,
                             uint32_t outCount) {
    uint32_t inPos = inOffset;
    uint32_t outPos = outOffset;
    uint32_t outEnd = outOffset + outCount;

    while (outPos < outEnd) {
      uint32_t remainingCount = outEnd - outPos;

      uint32_t val = input[inPos++];
      uint32_t code = val >> SIMPLE9_BITSIZE;

#if defined(_SIMPLE9_USE_RLE)
      if (code == RLE_SELECTOR_VALUE) {
        // decode rle-encoded integers
        uint32_t repeatValue = val & RLE_MAX_VALUE_MASK;
        uint32_t repeatCount = (val >> RLE_MAX_VALUE_BITS) & RLE_MAX_COUNT_MASK;
        repeatCount =
            (repeatCount < remainingCount) ? repeatCount : remainingCount;

        for (uint32_t i = 0; i < repeatCount; ++i) {
          output[outPos++] = repeatValue;
        }
      }
#else
      // optional check for end-of-stream
      if (SIMPLE9_MINCODE == 1 && code == 0) {
        break; // end of stream
      }
#endif
      else {
        // decode bit-packed integers
        uint32_t intNum = Simple9_Codec_intNumber[code];
        uint32_t bitLen = Simple9_Codec_bitLength[code];
        uint32_t bitMask = (1U << bitLen) - 1;
        intNum = (intNum < remainingCount)
                     ? intNum
                     : remainingCount; // optional buffer end check

#if defined(_DONT_UNROLL_LOOP)
        for (uint32_t i = 0; i < intNum; ++i) {
          output[outPos++] = val & bitMask;
          val >>= bitLen;
        }
#else
        uint32_t i = 0;
        for (; i < intNum; i += 7) {
          auto out = output + outPos + i;
          out[0] = val & bitMask;
          val >>= bitLen;
          out[1] = val & bitMask;
          val >>= bitLen;
          out[2] = val & bitMask;
          val >>= bitLen;
          out[3] = val & bitMask;
          val >>= bitLen;
          out[4] = val & bitMask;
          val >>= bitLen;
          out[5] = val & bitMask;
          val >>= bitLen;
          out[6] = val & bitMask;
          val >>= bitLen;
        }
        for (; i < intNum; ++i) {
          auto out = output + outPos + i;
          out[0] = val & bitMask;
          val >>= bitLen;
        }
        outPos += intNum;
#endif
      }
    }